

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

void nn_pipebase_init(nn_pipebase *self,nn_pipebase_vfptr *vfptr,nn_epbase *epbase)

{
  nn_sock *owner;
  nn_ep *pnVar1;
  int iVar2;
  
  owner = epbase->ep->sock;
  if (owner != (nn_sock *)0x0) {
    nn_fsm_init(&self->fsm,(nn_fsm_fn)0x0,(nn_fsm_fn)0x0,0,self,&owner->fsm);
    self->vfptr = vfptr;
    self->state = '\x01';
    self->instate = '\0';
    self->outstate = '\0';
    pnVar1 = epbase->ep;
    self->sock = pnVar1->sock;
    iVar2 = (pnVar1->options).rcvprio;
    (self->options).sndprio = (pnVar1->options).sndprio;
    (self->options).rcvprio = iVar2;
    (self->options).ipv4only = (pnVar1->options).ipv4only;
    nn_fsm_event_init(&self->in);
    nn_fsm_event_init(&self->out);
    return;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","epbase->ep->sock",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/pipe.c",
          0x34);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_pipebase_init (struct nn_pipebase *self,
    const struct nn_pipebase_vfptr *vfptr, struct nn_epbase *epbase)
{
    nn_assert (epbase->ep->sock);

    nn_fsm_init (&self->fsm, NULL, NULL, 0, self, &epbase->ep->sock->fsm);
    self->vfptr = vfptr;
    self->state = NN_PIPEBASE_STATE_IDLE;
    self->instate = NN_PIPEBASE_INSTATE_DEACTIVATED;
    self->outstate = NN_PIPEBASE_OUTSTATE_DEACTIVATED;
    self->sock = epbase->ep->sock;
    memcpy (&self->options, &epbase->ep->options,
        sizeof (struct nn_ep_options));
    nn_fsm_event_init (&self->in);
    nn_fsm_event_init (&self->out);
}